

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

Result emulator_read_state(Emulator *e,FileData *file_data)

{
  uint *__src;
  undefined8 uVar1;
  
  if (file_data->size == 0x30bc0) {
    __src = (uint *)file_data->data;
    if (*__src == 0x6b57a7e2) {
      memcpy(&e->state,__src,0x30bc0);
      set_cart_info(e,(e->state).cart_info_index);
      if ((e->state).is_sgb != FALSE) {
        uVar1 = *(undefined8 *)((e->state).sgb.screen_pal[0].color + 2);
        *(undefined8 *)e->color_to_rgba[1].color = *(undefined8 *)(e->state).sgb.screen_pal[0].color
        ;
        *(undefined8 *)(e->color_to_rgba[1].color + 2) = uVar1;
        update_bw_palette_rgba(e,PALETTE_TYPE_OBP0);
        uVar1 = *(undefined8 *)((e->state).sgb.screen_pal[0].color + 2);
        *(undefined8 *)e->color_to_rgba[2].color = *(undefined8 *)(e->state).sgb.screen_pal[0].color
        ;
        *(undefined8 *)(e->color_to_rgba[2].color + 2) = uVar1;
        update_bw_palette_rgba(e,PALETTE_TYPE_OBP1);
      }
      update_bw_palette_rgba(e,PALETTE_TYPE_BGP);
      update_bw_palette_rgba(e,PALETTE_TYPE_OBP0);
      update_bw_palette_rgba(e,PALETTE_TYPE_OBP1);
      return OK;
    }
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c",0x1349
           );
    fprintf(_stderr,"header mismatch: %u, expected %u.\n",(ulong)*__src,0x6b57a7e2);
  }
  else {
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c",0x1345
           );
    fprintf(_stderr,"save state file is wrong size: %ld, expected %ld.\n",file_data->size,0x30bc0);
  }
  return ERROR;
}

Assistant:

Result emulator_read_state(Emulator* e, const FileData* file_data) {
  CHECK_MSG(file_data->size == sizeof(EmulatorState),
            "save state file is wrong size: %ld, expected %ld.\n",
            (long)file_data->size, (long)sizeof(EmulatorState));
  EmulatorState* new_state = (EmulatorState*)file_data->data;
  CHECK_MSG(new_state->header == SAVE_STATE_HEADER,
            "header mismatch: %u, expected %u.\n", new_state->header,
            SAVE_STATE_HEADER);
  memcpy(&e->state, new_state, sizeof(EmulatorState));
  set_cart_info(e, e->state.cart_info_index);

  if (IS_SGB) {
    emulator_set_bw_palette(e, PALETTE_TYPE_OBP0, &SGB.screen_pal[0]);
    emulator_set_bw_palette(e, PALETTE_TYPE_OBP1, &SGB.screen_pal[0]);
  }
  update_bw_palette_rgba(e, PALETTE_TYPE_BGP);
  update_bw_palette_rgba(e, PALETTE_TYPE_OBP0);
  update_bw_palette_rgba(e, PALETTE_TYPE_OBP1);
  return OK;
  ON_ERROR_RETURN;
}